

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::switch_to_big
          (small_vector<pstore::command_line::literal,_3UL> *this,size_t new_elements)

{
  literal *__first;
  literal *plVar1;
  size_t sVar2;
  back_insert_iterator<std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __result;
  size_t new_elements_local;
  small_vector<pstore::command_line::literal,_3UL> *this_local;
  
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::clear
            (&this->big_buffer_);
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  reserve(&this->big_buffer_,new_elements);
  __first = this->buffer_;
  plVar1 = this->buffer_;
  sVar2 = this->elements_;
  __result = std::
             back_inserter<std::vector<pstore::command_line::literal,std::allocator<pstore::command_line::literal>>>
                       (&this->big_buffer_);
  std::
  copy<pstore::command_line::literal*,std::back_insert_iterator<std::vector<pstore::command_line::literal,std::allocator<pstore::command_line::literal>>>>
            (__first,plVar1 + sVar2,__result);
  set_buffer_ptr(this,new_elements);
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::switch_to_big (std::size_t new_elements) {
        big_buffer_.clear ();
        big_buffer_.reserve (new_elements);
        std::copy (buffer_, buffer_ + elements_, std::back_inserter (big_buffer_));
        this->set_buffer_ptr (new_elements);
    }